

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_remote_end_stream(nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  
  if ((stream->http_flags & 0x4000) == 0) {
    if ((stream->content_length == -1) || (stream->content_length == stream->recv_content_length)) {
      stream_local._4_4_ = 0;
    }
    else {
      stream_local._4_4_ = -1;
    }
  }
  else {
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int nghttp2_http_on_remote_end_stream(nghttp2_stream *stream) {
  if (stream->http_flags & NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE) {
    return -1;
  }

  if (stream->content_length != -1 &&
      stream->content_length != stream->recv_content_length) {
    return -1;
  }

  return 0;
}